

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::CreateScenarioLowerBound(BaseRockSample *this)

{
  string *in_RDX;
  string *in_RSI;
  
  CreateScenarioLowerBound
            ((BaseRockSample *)
             &this[-1].transition_probabilities_.
              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_RDX);
  return;
}

Assistant:

ScenarioLowerBound* BaseRockSample::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		// scenario_lower_bound_ = new BlindPolicy(this, Compass::EAST);
		return new RockSampleEastScenarioLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "ENT") {
		return new RockSampleENTScenarioLowerBound(this);
	} else if (name == "MMAP") {
		return new RockSampleMMAPStateScenarioLowerBound(this);
	} else if (name == "MODE") {
		// scenario_lower_bound_ = new ModeStatePolicy(this);
		return NULL; // TODO
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
		return NULL;
	}
}